

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O0

int AF_A_SpawnFizzle(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  DObject *this;
  double dVar1;
  int iVar2;
  AActor *pAVar3;
  bool bVar4;
  bool local_9e;
  bool local_9b;
  TAngle<double> local_98;
  FName local_8c;
  TAngle<double> local_88;
  undefined1 local_80 [8];
  DVector3 pos;
  int ix;
  AActor *mo;
  DAngle rangle;
  int speed;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                  ,0x2b3,"int AF_A_SpawnFizzle(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar4) {
    pAVar3 = (AActor *)(param->field_0).field_1.a;
    local_9b = true;
    if (pAVar3 != (AActor *)0x0) {
      local_9b = DObject::IsKindOf((DObject *)pAVar3,AActor::RegistrationInfo.MyClass);
    }
    if (local_9b != false) {
      if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
        bVar4 = false;
        if ((param[1].field_0.field_3.Type == '\x03') &&
           (bVar4 = true, param[1].field_0.field_1.atag != 1)) {
          bVar4 = param[1].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar4) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                        ,0x2b3,
                        "int AF_A_SpawnFizzle(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        this = (DObject *)param[1].field_0.field_1.a;
        local_9e = true;
        if (this != (DObject *)0x0) {
          local_9e = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
        }
        if (local_9e == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                        ,0x2b3,
                        "int AF_A_SpawnFizzle(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
        bVar4 = false;
        if ((param[2].field_0.field_3.Type == '\x03') &&
           (bVar4 = true, param[2].field_0.field_1.atag != 8)) {
          bVar4 = param[2].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar4) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                        ,0x2b3,
                        "int AF_A_SpawnFizzle(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      rangle.Degrees._4_4_ = (int)pAVar3->Speed;
      TAngle<double>::TAngle((TAngle<double> *)&mo);
      TAngle<double>::TAngle(&local_88,&(pAVar3->Angles).Yaw);
      AActor::Vec3Angle((DVector3 *)local_80,pAVar3,5.0,&local_88,
                        -pAVar3->Floorclip + pAVar3->Height / 2.0,false);
      for (pos.Z._4_4_ = 0; pos.Z._4_4_ < 5; pos.Z._4_4_ = pos.Z._4_4_ + 1) {
        FName::FName(&local_8c,"SorcSpark1");
        pAVar3 = Spawn(&local_8c,(DVector3 *)local_80,ALLOW_REPLACE);
        if (pAVar3 != (AActor *)0x0) {
          iVar2 = FRandom::operator()(&pr_heresiarch);
          TAngle<double>::operator+(&local_98,(double)(iVar2 % 5) * 11.377777777777778);
          TAngle<double>::operator=((TAngle<double> *)&mo,&local_98);
          iVar2 = FRandom::operator()(&pr_heresiarch);
          iVar2 = iVar2 % rangle.Degrees._4_4_;
          dVar1 = TAngle<double>::Cos((TAngle<double> *)&mo);
          (pAVar3->Vel).X = (double)iVar2 * dVar1;
          iVar2 = FRandom::operator()(&pr_heresiarch);
          iVar2 = iVar2 % rangle.Degrees._4_4_;
          dVar1 = TAngle<double>::Sin((TAngle<double> *)&mo);
          (pAVar3->Vel).Y = (double)iVar2 * dVar1;
          (pAVar3->Vel).Z = 2.0;
        }
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                  ,0x2b3,"int AF_A_SpawnFizzle(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                ,0x2b3,"int AF_A_SpawnFizzle(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SpawnFizzle)
{
	PARAM_ACTION_PROLOGUE;
	int speed = (int)self->Speed;
	DAngle rangle;
	AActor *mo;
	int ix;

	DVector3 pos = self->Vec3Angle(5., self->Angles.Yaw, -self->Floorclip + self->Height / 2. );
	for (ix=0; ix<5; ix++)
	{
		mo = Spawn("SorcSpark1", pos, ALLOW_REPLACE);
		if (mo)
		{
			rangle = self->Angles.Yaw + (pr_heresiarch() % 5) * (4096 / 360.);
			mo->Vel.X = (pr_heresiarch() % speed) * rangle.Cos();
			mo->Vel.Y = (pr_heresiarch() % speed) * rangle.Sin();
			mo->Vel.Z = 2;
		}
	}
	return 0;
}